

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

int __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
::ReadOpCode(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
             *this)

{
  uint uVar1;
  ulong local_28 [2];
  ArgList local_18;
  
  uVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
  if ((int)uVar1 < 0x53) {
    return uVar1;
  }
  local_28[0] = (ulong)uVar1;
  local_18.types_ = 2;
  local_18.field_1.values_ = (Value *)local_28;
  BinaryReaderBase::ReportError
            (&this->reader_->super_BinaryReaderBase,(CStringRef)0x26a0a7,&local_18);
}

Assistant:

int ReadOpCode() {
    int opcode = reader_.ReadUInt();
    if (opcode > internal::MAX_OPCODE)
      reader_.ReportError("invalid opcode {}", opcode);
    reader_.ReadTillEndOfLine();
    return opcode;
  }